

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureUnitTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::MultiTexShader::makeSafeLods
          (MultiTexShader *this,
          vector<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_> *textureSizes,
          IVec2 *viewportSize)

{
  undefined8 uVar1;
  pointer pVVar2;
  pointer pVVar3;
  ulong uVar4;
  int iVar5;
  Mat4 *a;
  int iVar6;
  int unitNdx;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  float fVar11;
  undefined1 auVar12 [16];
  float fVar13;
  float fVar15;
  float fVar21;
  undefined1 auVar16 [16];
  float fVar14;
  float fVar22;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  Mat4 shrinkScaleMat3d;
  Mat4 shrinkScaleMat2d;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f0 [16];
  float local_e0 [12];
  Mat4 local_b0;
  Mat4 local_70;
  
  tcu::Matrix<float,_3,_3>::Matrix
            ((Matrix<float,_3,_3> *)&local_b0,makeSafeLods::shrinkScaleMat2dData);
  matExtend3To4(&local_70,(Mat3 *)&local_b0);
  tcu::Matrix<float,_3,_3>::Matrix
            ((Matrix<float,_3,_3> *)local_f0,makeSafeLods::shrinkScaleMat3dData);
  matExtend3To4(&local_b0,(Mat3 *)local_f0);
  auVar16._0_4_ = (float)(int)*(undefined8 *)viewportSize->m_data;
  auVar16._4_4_ = (float)(int)((ulong)*(undefined8 *)viewportSize->m_data >> 0x20);
  auVar16._8_8_ = 0;
  auVar16 = divps(_DAT_009a4d00,auVar16);
  fVar13 = auVar16._0_4_;
  fVar21 = auVar16._4_4_;
  lVar7 = 0;
LAB_005b78dd:
  if (*(int *)&(this->super_ShaderProgram).field_0x154 <= lVar7) {
    return;
  }
  do {
    pVVar2 = (this->m_lodDerivateParts).
             super__Vector_base<tcu::Vector<tcu::Vector<float,_2>,_3>,_std::allocator<tcu::Vector<tcu::Vector<float,_2>,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pVVar3 = (textureSizes->
             super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>)._M_impl
             .super__Vector_impl_data._M_start;
    fVar11 = (float)pVVar3[lVar7].m_data[2];
    uVar1 = *(undefined8 *)pVVar3[lVar7].m_data;
    fVar14 = (float)(int)uVar1;
    fVar22 = (float)(int)((ulong)uVar1 >> 0x20);
    auVar23._0_4_ = pVVar2[lVar7].m_data[0].m_data[0] * fVar14 * fVar13;
    auVar23._4_4_ = pVVar2[lVar7].m_data[1].m_data[0] * fVar22 * fVar13;
    auVar23._8_4_ = fVar13 * 0.0;
    auVar23._12_4_ = fVar13 * 0.0;
    auVar28._0_4_ = pVVar2[lVar7].m_data[0].m_data[1] * fVar14 * fVar21;
    auVar28._4_4_ = pVVar2[lVar7].m_data[1].m_data[1] * fVar22 * fVar21;
    auVar28._8_4_ = fVar21 * 0.0;
    auVar28._12_4_ = fVar21 * 0.0;
    uVar4 = CONCAT44(auVar23._4_4_,auVar23._0_4_);
    auVar17._0_8_ = uVar4 ^ 0x8000000080000000;
    auVar17._8_4_ = -auVar23._8_4_;
    auVar17._12_4_ = -auVar23._12_4_;
    auVar18 = maxps(auVar17,auVar23);
    uVar4 = CONCAT44(auVar28._4_4_,auVar28._0_4_);
    auVar24._0_8_ = uVar4 ^ 0x8000000080000000;
    auVar24._8_4_ = -auVar28._8_4_;
    auVar24._12_4_ = -auVar28._12_4_;
    auVar25 = maxps(auVar24,auVar28);
    uVar8 = -(uint)(auVar25._0_4_ <= auVar18._0_4_);
    uVar10 = -(uint)(auVar25._4_4_ <= auVar18._4_4_);
    uVar1 = *(undefined8 *)pVVar2[lVar7].m_data[2].m_data;
    fStack_100 = auVar16._8_4_;
    fStack_fc = auVar16._12_4_;
    auVar20._0_4_ = fVar11 * (float)uVar1 * fVar13;
    auVar20._4_4_ = fVar11 * (float)((ulong)uVar1 >> 0x20) * fVar21;
    auVar20._8_4_ = fVar11 * 0.0 * fStack_100;
    auVar20._12_4_ = fVar11 * 0.0 * fStack_fc;
    uVar4 = CONCAT44(auVar20._4_4_,auVar20._0_4_);
    auVar19._0_8_ = uVar4 ^ 0x8000000080000000;
    auVar19._8_4_ = -auVar20._8_4_;
    auVar19._12_4_ = -auVar20._12_4_;
    auVar20 = maxps(auVar19,auVar20);
    uVar9 = -(uint)(auVar20._4_4_ <= auVar20._0_4_);
    fVar11 = deFloatLog2((float)(~uVar10 & (uint)auVar25._4_4_ | (uint)auVar18._4_4_ & uVar10) +
                         (float)(~uVar8 & (uint)auVar25._0_4_ | (uint)auVar18._0_4_ & uVar8) +
                         (float)(~uVar9 & (uint)auVar20._4_4_ | (uint)auVar20._0_4_ & uVar9));
    pVVar2 = (this->m_lodDerivateParts).
             super__Vector_base<tcu::Vector<tcu::Vector<float,_2>,_3>,_std::allocator<tcu::Vector<tcu::Vector<float,_2>,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pVVar3 = (textureSizes->
             super__Vector_base<tcu::Vector<int,_3>,_std::allocator<tcu::Vector<int,_3>_>_>)._M_impl
             .super__Vector_impl_data._M_start;
    fVar14 = (float)pVVar3[lVar7].m_data[0];
    uVar1 = *(undefined8 *)pVVar2[lVar7].m_data[0].m_data;
    auVar25._0_4_ = fVar14 * (float)uVar1 * fVar13;
    auVar25._4_4_ = fVar14 * (float)((ulong)uVar1 >> 0x20) * fVar21;
    auVar25._8_4_ = fVar14 * 0.0 * fStack_100;
    auVar25._12_4_ = fVar14 * 0.0 * fStack_fc;
    uVar4 = CONCAT44(auVar25._4_4_,auVar25._0_4_);
    auVar26._0_8_ = uVar4 ^ 0x8000000080000000;
    auVar26._8_4_ = -auVar25._8_4_;
    auVar26._12_4_ = -auVar25._12_4_;
    auVar18 = maxps(auVar26,auVar25);
    uVar8 = -(uint)(auVar18._4_4_ <= auVar18._0_4_);
    fVar15 = (float)(~uVar8 & (uint)auVar18._4_4_ | (uint)auVar18._0_4_ & uVar8);
    uVar1 = *(undefined8 *)(pVVar3[lVar7].m_data + 1);
    fVar14 = (float)(int)uVar1;
    fVar22 = (float)(int)((ulong)uVar1 >> 0x20);
    auVar29._0_4_ = pVVar2[lVar7].m_data[1].m_data[0] * fVar14 * fVar13;
    auVar29._4_4_ = pVVar2[lVar7].m_data[2].m_data[0] * fVar22 * fVar13;
    auVar29._8_4_ = fVar13 * 0.0;
    auVar29._12_4_ = fVar13 * 0.0;
    fVar14 = pVVar2[lVar7].m_data[1].m_data[1] * fVar14 * fVar21;
    fVar22 = pVVar2[lVar7].m_data[2].m_data[1] * fVar22 * fVar21;
    uVar4 = CONCAT44(auVar29._4_4_,auVar29._0_4_);
    auVar12._0_8_ = uVar4 ^ 0x8000000080000000;
    auVar12._8_4_ = -auVar29._8_4_;
    auVar12._12_4_ = -auVar29._12_4_;
    auVar20 = maxps(auVar12,auVar29);
    auVar27._0_8_ = CONCAT44(fVar22,fVar14) ^ 0x8000000080000000;
    auVar27._8_4_ = -(fVar21 * 0.0);
    auVar27._12_4_ = -(fVar21 * 0.0);
    auVar18._4_4_ = fVar22;
    auVar18._0_4_ = fVar14;
    auVar18._8_4_ = fVar21 * 0.0;
    auVar18._12_4_ = fVar21 * 0.0;
    auVar18 = maxps(auVar27,auVar18);
    uVar8 = -(uint)(auVar18._0_4_ <= auVar20._0_4_);
    uVar9 = -(uint)(auVar18._4_4_ <= auVar20._4_4_);
    fVar14 = (float)(~uVar8 & (uint)auVar18._0_4_ | (uint)auVar20._0_4_ & uVar8);
    fVar22 = (float)(~uVar9 & (uint)auVar18._4_4_ | (uint)auVar20._4_4_ & uVar9);
    uVar8 = -(uint)(fVar22 <= fVar14);
    fVar14 = (float)(~uVar8 & (uint)fVar22 | (uint)fVar14 & uVar8);
    uVar8 = -(uint)(fVar14 <= fVar15);
    fVar14 = deFloatLog2((float)(uVar8 & (uint)fVar15 | ~uVar8 & (uint)fVar14));
    iVar5 = 0;
    iVar6 = 0;
    if (0.5 <= fVar11 + 0.01) {
      fVar22 = ceilf(fVar11 + 0.01 + 0.5);
      iVar6 = (int)fVar22 + -1;
    }
    if (0.5 <= fVar14 + -0.01) {
      fVar22 = ceilf(fVar14 + -0.01 + 0.5);
      iVar5 = (int)fVar22 + -1;
    }
    fVar22 = -fVar11;
    if (-fVar11 <= fVar11) {
      fVar22 = fVar11;
    }
    if (0.1 <= fVar22) {
      if (0.0 < fVar11) {
        fVar22 = floorf(fVar11);
        fVar22 = (fVar11 - fVar22) + -0.5;
        fVar11 = -fVar22;
        if (-fVar22 <= fVar22) {
          fVar11 = fVar22;
        }
        if (fVar11 < 0.1) goto LAB_005b7bc9;
      }
      fVar11 = -fVar14;
      if (-fVar14 <= fVar14) {
        fVar11 = fVar14;
      }
      if (0.1 <= fVar11) {
        if (0.0 < fVar14) {
          fVar11 = floorf(fVar14);
          fVar14 = (fVar14 - fVar11) + -0.5;
          fVar11 = -fVar14;
          if (-fVar14 <= fVar14) {
            fVar11 = fVar14;
          }
          if (fVar11 < 0.1) goto LAB_005b7bc9;
        }
        if (iVar6 == iVar5) break;
      }
    }
LAB_005b7bc9:
    a = &local_70;
    if ((this->m_unitTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar7] == 0x806f) {
      a = &local_b0;
    }
    tcu::operator*((Matrix<float,_4,_4> *)local_f0,a,
                   (this->m_transformations).
                   super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar7);
    tcu::Matrix<float,_4,_4>::operator=
              ((this->m_transformations).
               super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar7,(Matrix<float,_4,_4> *)local_f0);
    calculateLodDerivateParts
              ((Vector<tcu::Vector<float,_2>,_3> *)local_f0,
               (this->m_transformations).
               super__Vector_base<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar7);
    pVVar2 = (this->m_lodDerivateParts).
             super__Vector_base<tcu::Vector<tcu::Vector<float,_2>,_3>,_std::allocator<tcu::Vector<tcu::Vector<float,_2>,_3>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(undefined8 *)pVVar2[lVar7].m_data[2].m_data = local_e0._0_8_;
    pVVar2 = pVVar2 + lVar7;
    *(undefined8 *)pVVar2->m_data[0].m_data = local_f0._0_8_;
    *(undefined8 *)pVVar2->m_data[1].m_data = local_f0._8_8_;
  } while( true );
  lVar7 = lVar7 + 1;
  goto LAB_005b78dd;
}

Assistant:

void MultiTexShader::makeSafeLods (const vector<IVec3>& textureSizes, const IVec2& viewportSize)
{
	DE_ASSERT((int)textureSizes.size() == m_numUnits);

	static const float shrinkScaleMat2dData[3*3] =
	{
		0.95f,	0.0f,	0.0f,
		0.0f,	0.95f,	0.0f,
		0.0f,	0.0f,	1.0f
	};
	static const float shrinkScaleMat3dData[3*3] =
	{
		0.95f,	0.0f,	0.0f,
		0.0f,	0.95f,	0.0f,
		0.0f,	0.0f,	0.95f
	};
	Mat4 shrinkScaleMat2d = matExtend3To4(Mat3(shrinkScaleMat2dData));
	Mat4 shrinkScaleMat3d = matExtend3To4(Mat3(shrinkScaleMat3dData));

	Vec2 screenDerivate(1.0f / (float)viewportSize.x(), 1.0f / (float)viewportSize.y());

	for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
	{
		// As long as LOD is too close to 0.0 or is positive and too close to a something-and-a-half (0.5, 1.5, 2.5 etc) or allowed lod range could round to different levels, zoom in a little to get a safer LOD.
		for (;;)
		{
			const float threshold = 0.1f;
			const float epsilon	= 0.01f;

			const float lodMax = calculateLodMax(m_lodDerivateParts[unitNdx], textureSizes[unitNdx], screenDerivate);
			const float lodMin = calculateLodMin(m_lodDerivateParts[unitNdx], textureSizes[unitNdx], screenDerivate);

			const deInt32 maxLevel = (lodMax + epsilon < 0.5f) ? (0) : (deCeilFloatToInt32(lodMax + epsilon + 0.5f) - 1);
			const deInt32 minLevel = (lodMin - epsilon < 0.5f) ? (0) : (deCeilFloatToInt32(lodMin - epsilon + 0.5f) - 1);

			if (de::abs(lodMax) < threshold || (lodMax > 0.0f && de::abs(deFloatFrac(lodMax) - 0.5f) < threshold) ||
				de::abs(lodMin) < threshold || (lodMin > 0.0f && de::abs(deFloatFrac(lodMin) - 0.5f) < threshold) ||
				maxLevel != minLevel)
			{
				m_transformations[unitNdx] = (m_unitTypes[unitNdx] == GL_TEXTURE_3D ? shrinkScaleMat3d : shrinkScaleMat2d) * m_transformations[unitNdx];
				m_lodDerivateParts[unitNdx] = calculateLodDerivateParts(m_transformations[unitNdx]);
			}
			else
				break;
		}
	}
}